

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O3

void __thiscall
slang::ast::Compilation::noteDefaultClocking
          (Compilation *this,ASTContext *context,DefaultClockingReferenceSyntax *syntax)

{
  undefined8 uVar1;
  undefined4 uVar2;
  Symbol *clocking;
  Diagnostic *this_00;
  LookupLocation location;
  string_view name;
  SourceRange sourceRange;
  
  name = parsing::Token::valueText(&syntax->name);
  sourceRange = parsing::Token::range(&syntax->name);
  uVar1 = context->scope;
  uVar2 = context->lookupIndex;
  location.index = uVar2;
  location.scope = (Scope *)uVar1;
  location._12_4_ = 0;
  clocking = Lookup::unqualifiedAt
                       ((context->scope).ptr,name,location,sourceRange,
                        (bitmask<slang::ast::LookupFlags>)0x0);
  if (clocking == (Symbol *)0x0) {
    return;
  }
  if (clocking->kind == ClockingBlock) {
    noteDefaultClocking(this,(context->scope).ptr,clocking,sourceRange);
    return;
  }
  this_00 = ASTContext::addDiag(context,(DiagCode)0x8d0006,sourceRange);
  Diagnostic::operator<<(this_00,name);
  Diagnostic::addNote(this_00,(DiagCode)0x50001,clocking->location);
  return;
}

Assistant:

void Compilation::noteDefaultClocking(const ASTContext& context,
                                      const DefaultClockingReferenceSyntax& syntax) {
    SLANG_ASSERT(!isFrozen());

    auto name = syntax.name.valueText();
    auto range = syntax.name.range();
    auto sym = Lookup::unqualifiedAt(*context.scope, name, context.getLocation(), range);
    if (!sym)
        return;

    if (sym->kind != SymbolKind::ClockingBlock) {
        auto& diag = context.addDiag(diag::NotAClockingBlock, range);
        diag << name;
        diag.addNote(diag::NoteDeclarationHere, sym->location);
        return;
    }

    noteDefaultClocking(*context.scope, *sym, range);
}